

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O2

ze_result_t
zetGetMetricProgrammableExpProcAddrTable
          (ze_api_version_t version,zet_metric_programmable_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zet_pfnMetricProgrammableGetExp_t p_Var3;
  zet_pfnMetricProgrammableGetPropertiesExp_t p_Var4;
  zet_pfnMetricProgrammableGetParamValueInfoExp_t p_Var5;
  ze_result_t zVar6;
  code *UNRECOVERED_JUMPTABLE;
  long lVar7;
  iterator __begin1;
  undefined8 *puVar8;
  
  puVar8 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (puVar1 != puVar8) {
    if (pDdiTable == (zet_metric_programmable_exp_dditable_t *)0x0) {
      zVar6 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
      if ((int)version <= *(int *)(loader::context + 0x15c0)) {
        zVar6 = ZE_RESULT_SUCCESS;
        for (; puVar8 != puVar1; puVar8 = puVar8 + 0x1b3) {
          if (*(int *)(puVar8 + 1) == 0) {
            UNRECOVERED_JUMPTABLE =
                 (code *)dlsym(*puVar8,"zetGetMetricProgrammableExpProcAddrTable");
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar6 = (*UNRECOVERED_JUMPTABLE)(version,puVar8 + 0xce);
            }
          }
        }
        if (zVar6 == ZE_RESULT_SUCCESS) {
          lVar2 = *(long *)(loader::context + 0x15e0);
          lVar7 = *(long *)(loader::context + 0x15e8) - lVar2;
          if (((ulong)(lVar7 / 0xd98) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
            p_Var3 = *(zet_pfnMetricProgrammableGetExp_t *)(lVar2 + 0x670);
            p_Var4 = *(zet_pfnMetricProgrammableGetPropertiesExp_t *)(lVar2 + 0x678);
            p_Var5 = *(zet_pfnMetricProgrammableGetParamValueInfoExp_t *)(lVar2 + 0x688);
            pDdiTable->pfnGetParamInfoExp =
                 *(zet_pfnMetricProgrammableGetParamInfoExp_t *)(lVar2 + 0x680);
            pDdiTable->pfnGetParamValueInfoExp = p_Var5;
            pDdiTable->pfnGetExp = p_Var3;
            pDdiTable->pfnGetPropertiesExp = p_Var4;
          }
          else {
            pDdiTable->pfnGetExp = loader::zetMetricProgrammableGetExp;
            pDdiTable->pfnGetPropertiesExp = loader::zetMetricProgrammableGetPropertiesExp;
            pDdiTable->pfnGetParamInfoExp = loader::zetMetricProgrammableGetParamInfoExp;
            pDdiTable->pfnGetParamValueInfoExp = loader::zetMetricProgrammableGetParamValueInfoExp;
          }
          if (*(long *)(loader::context + 0x1618) == 0) {
            zVar6 = ZE_RESULT_SUCCESS;
          }
          else {
            UNRECOVERED_JUMPTABLE =
                 (code *)dlsym(*(long *)(loader::context + 0x1618),
                               "zetGetMetricProgrammableExpProcAddrTable",lVar7 % 0xd98);
            zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar6 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
              return zVar6;
            }
          }
        }
      }
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricProgrammableExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_programmable_exp_dditable_t* pDdiTable   ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zet_pfnGetMetricProgrammableExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zetGetMetricProgrammableExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.zet.MetricProgrammableExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetExp                                   = loader::zetMetricProgrammableGetExp;
            pDdiTable->pfnGetPropertiesExp                         = loader::zetMetricProgrammableGetPropertiesExp;
            pDdiTable->pfnGetParamInfoExp                          = loader::zetMetricProgrammableGetParamInfoExp;
            pDdiTable->pfnGetParamValueInfoExp                     = loader::zetMetricProgrammableGetParamValueInfoExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.zet.MetricProgrammableExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zet_pfnGetMetricProgrammableExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zetGetMetricProgrammableExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}